

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPUDPv4Transmitter::RTPUDPv4Transmitter(RTPUDPv4Transmitter *this,RTPMemoryManager *mgr)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject.mgr = mgr;
  timeinit = timeinit + 1;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv4Transmitter_00144090;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->localIPs;
  (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  _M_size = 0;
  RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
  ::RTPHashTable(&this->destinations,mgr,0xd);
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::RTPHashTable
            (&this->multicastgroups,mgr,0xe);
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node._M_size = 0;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::RTPKeyHashTable(&this->acceptignoreinfo,mgr,0xb);
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->init = false;
  this->created = false;
  return;
}

Assistant:

RTPUDPv4Transmitter::RTPUDPv4Transmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr),destinations(mgr,RTPMEM_TYPE_CLASS_DESTINATIONLISTHASHELEMENT),
#ifdef RTP_SUPPORT_IPV4MULTICAST
								  multicastgroups(mgr,RTPMEM_TYPE_CLASS_MULTICASTHASHELEMENT),
#endif // RTP_SUPPORT_IPV4MULTICAST
								  acceptignoreinfo(mgr,RTPMEM_TYPE_CLASS_ACCEPTIGNOREHASHELEMENT)
{
	created = false;
	init = false;
}